

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy.c
# Opt level: O1

char * strncpy(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  char *pcVar2;
  char *__s;
  
  __s = __dest;
  if (__n != 0) {
    pcVar2 = __dest + 1;
    do {
      __s = pcVar2;
      cVar1 = *__src;
      __s[-1] = cVar1;
      if (cVar1 == '\0') goto LAB_00101158;
      __src = __src + 1;
      __n = __n - 1;
      pcVar2 = __s + 1;
    } while (__n != 0);
    __n = 0;
  }
LAB_00101158:
  if (1 < __n) {
    memset(__s,0,__n - 1);
  }
  return __dest;
}

Assistant:

char * strncpy( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( n && ( *s1++ = *s2++ ) )
    {
        /* Cannot do "n--" in the conditional as size_t is unsigned and we have
           to check it again for >0 in the next loop below, so we must not risk
           underflow.
        */
        --n;
    }

    /* Checking against 1 as we missed the last --n in the loop above. */
    while ( n-- > 1 )
    {
        *s1++ = '\0';
    }

    return rc;
}